

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O1

string * __thiscall
helics::Federate::query_abi_cxx11_
          (string *__return_storage_ptr__,Federate *this,string_view queryStr,
          HelicsSequencingModes mode)

{
  long lVar1;
  element_type *peVar2;
  int iVar3;
  undefined4 extraout_var;
  char *__s1;
  size_t sVar4;
  size_type __rlen;
  json V;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  local_80;
  string_t local_70;
  undefined1 local_50 [32];
  
  __s1 = queryStr._M_str;
  sVar4 = queryStr._M_len;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (sVar4 == 8) {
    iVar3 = bcmp(__s1,"corename",8);
    if (iVar3 == 0) {
      iVar3 = (*((this->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->_vptr_Core[0xc])();
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::
      basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_80,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(extraout_var,iVar3));
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::dump(&local_70,&local_80,-1,' ',true,hex);
      query_abi_cxx11_();
      goto LAB_001e8f74;
    }
  }
  else if (sVar4 == 4) {
    iVar3 = bcmp(__s1,"name",4);
    if (iVar3 == 0) {
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::
      basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_80,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&this->mName);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::dump(&local_70,&local_80,-1,' ',true,hex);
      query_abi_cxx11_();
      goto LAB_001e8f74;
    }
    iVar3 = bcmp(__s1,"time",4);
    if (iVar3 == 0) {
      lVar1 = (this->mCurrentTime).internalTimeCode;
      __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_70,
                 vsnprintf,0x148,"%f",
                 (double)(lVar1 % 1000000000) * 1e-09 + (double)(lVar1 / 1000000000));
      query_abi_cxx11_();
      goto LAB_001e8f74;
    }
  }
  (*this->_vptr_Federate[0xe])(&local_70,this,sVar4,__s1);
  query_abi_cxx11_();
LAB_001e8f74:
  if (__return_storage_ptr__->_M_string_length == 0) {
    peVar2 = (this->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (*peVar2->_vptr_Core[0x5e])
              (local_50,peVar2,(this->mName)._M_string_length,(this->mName)._M_dataplus._M_p,sVar4,
               __s1,mode);
    query_abi_cxx11_();
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Federate::query(std::string_view queryStr, HelicsSequencingModes mode)
{
    std::string res;
    if (queryStr == "name") {
        res = generateJsonQuotedString(getName());
    } else if (queryStr == "corename") {
        res = generateJsonQuotedString(coreObject->getIdentifier());
    } else if (queryStr == "time") {
        res = std::to_string(mCurrentTime);
    } else {
        res = localQuery(queryStr);
    }
    if (res.empty()) {
        res = coreObject->query(getName(), queryStr, mode);
    }
    return res;
}